

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t Array_calcSizeBinary(void *src,size_t length,UA_DataType *type)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((type->field_0x25 & 4) == 0) {
    if ((type->field_0x25 & 1) == 0) {
      uVar3 = 0x19;
    }
    else {
      uVar3 = (ulong)type->typeIndex;
    }
    sVar2 = 4;
    while (bVar4 = length != 0, length = length - 1, bVar4) {
      lVar1 = (*(code *)(&calcSizeBinaryJumpTable)[uVar3])(src,type);
      sVar2 = sVar2 + lVar1;
      src = (void *)((long)src + (ulong)type->memSize);
    }
  }
  else {
    sVar2 = type->memSize * length + 4;
  }
  return sVar2;
}

Assistant:

static size_t
Array_calcSizeBinary(const void *src, size_t length, const UA_DataType *type) {
    size_t s = 4; // length
    if(type->overlayable) {
        s += type->memSize * length;
        return s;
    }
    uintptr_t ptr = (uintptr_t)src;
    size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
    for(size_t i = 0; i < length; ++i) {
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, type);
        ptr += type->memSize;
    }
    return s;
}